

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyTLASState
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,TopLevelASType *TLAS,
          RESOURCE_STATE RequiredState,char *OperationName)

{
  bool bVar1;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  char (*Args_7) [132];
  char *OperationName_local;
  String local_78;
  string _msg;
  String local_38;
  
  if ((TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_State != RESOURCE_STATE_UNKNOWN)
  {
    OperationName_local = OperationName;
    bVar1 = TopLevelASBase<Diligent::EngineVkImplTraits>::CheckState
                      (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,RequiredState);
    if (!bVar1) {
      GetResourceStateString_abi_cxx11_(&local_78,(Diligent *)(ulong)RequiredState,State);
      Args_7 = (char (*) [132])0x291852;
      GetResourceStateString_abi_cxx11_
                (&local_38,
                 (Diligent *)
                 (ulong)(TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_State,State_00)
      ;
      FormatString<char_const*,char[17],char_const*,char[25],std::__cxx11::string,char[28],std::__cxx11::string,char[132]>
                (&_msg,(Diligent *)&OperationName_local,(char **)" requires TLAS \'",
                 (char (*) [17])
                 &(TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                  .m_Desc,(char **)"\' to be transitioned to ",(char (*) [25])&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " state. Actual TLAS state: ",(char (*) [28])&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ". Use appropriate state transition flags or explicitly transition the TLAS using IDeviceContext::TransitionResourceStates() method."
                 ,Args_7);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifyTLASState(
    const TopLevelASType& TLAS,
    RESOURCE_STATE        RequiredState,
    const char*           OperationName) const
{
    if (TLAS.IsInKnownState() && !TLAS.CheckState(RequiredState))
    {
        LOG_ERROR_MESSAGE(OperationName, " requires TLAS '", TLAS.GetDesc().Name, "' to be transitioned to ", GetResourceStateString(RequiredState),
                          " state. Actual TLAS state: ", GetResourceStateString(TLAS.GetState()),
                          ". Use appropriate state transition flags or explicitly transition the TLAS using IDeviceContext::TransitionResourceStates() method.");
    }
}